

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateReductionTypeLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint32 uVar1;
  uint32 uVar2;
  Rep *pRVar3;
  long lVar4;
  bool bVar5;
  Type *pTVar6;
  ReduceLogSumExpLayerParams *pRVar7;
  long *plVar8;
  ReduceMeanLayerParams *pRVar9;
  ReduceL2LayerParams *pRVar10;
  ReduceSumSquareLayerParams *pRVar11;
  ReduceLogSumLayerParams *pRVar12;
  ReduceMinLayerParams *pRVar13;
  ReduceProdLayerParams *pRVar14;
  ReduceSumLayerParams *pRVar15;
  ReduceL1LayerParams *pRVar16;
  ReduceMaxLayerParams *pRVar17;
  long *plVar18;
  long lVar19;
  string err;
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Result::Result(&r);
  validateInputCount((Result *)&err,layer,1,1);
  Result::operator=(&r,(Result *)&err);
  std::__cxx11::string::~string((string *)&err._M_string_length);
  bVar5 = Result::good(&r);
  if (bVar5) {
    validateOutputCount((Result *)&err,layer,1,1);
    Result::operator=(&r,(Result *)&err);
    std::__cxx11::string::~string((string *)&err._M_string_length);
  }
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
LAB_00253f7c:
    Result::Result(__return_storage_ptr__,&r);
  }
  else {
    pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Tensor>::TypeHandler>
                       (&(layer->inputtensor_).super_RepeatedPtrFieldBase,0);
    uVar1 = pTVar6->rank_;
    lVar19 = (long)(int)uVar1;
    std::operator+(&local_38,
                   "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                   (layer->name_).ptr_);
    std::operator+(&err,&local_38,"\' layer.");
    std::__cxx11::string::~string((string *)&local_38);
    uVar2 = layer->_oneof_case_[0];
    if (uVar2 == 0x4e2) {
      pRVar16 = Specification::NeuralNetworkLayer::reducel1(layer);
      pRVar3 = (pRVar16->axes_).rep_;
      plVar18 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        plVar18 = (long *)0x0;
      }
      plVar8 = pRVar3->elements + (pRVar16->axes_).current_size_;
      if (pRVar3 == (Rep *)0x0) {
        plVar8 = (long *)0x0;
      }
      do {
        if (plVar18 == plVar8) goto LAB_00253f74;
        lVar4 = *plVar18;
      } while ((SBORROW8(lVar4,-lVar19) == lVar4 + lVar19 < 0) &&
              (plVar18 = plVar18 + 1, lVar4 < lVar19));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x4e7) {
      pRVar10 = Specification::NeuralNetworkLayer::reducel2(layer);
      pRVar3 = (pRVar10->axes_).rep_;
      plVar18 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        plVar18 = (long *)0x0;
      }
      plVar8 = pRVar3->elements + (pRVar10->axes_).current_size_;
      if (pRVar3 == (Rep *)0x0) {
        plVar8 = (long *)0x0;
      }
      do {
        if (plVar18 == plVar8) goto LAB_00253f74;
        lVar4 = *plVar18;
      } while ((SBORROW8(lVar4,-lVar19) == lVar4 + lVar19 < 0) &&
              (plVar18 = plVar18 + 1, lVar4 < lVar19));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x4ec) {
      pRVar17 = Specification::NeuralNetworkLayer::reducemax(layer);
      pRVar3 = (pRVar17->axes_).rep_;
      plVar18 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        plVar18 = (long *)0x0;
      }
      plVar8 = pRVar3->elements + (pRVar17->axes_).current_size_;
      if (pRVar3 == (Rep *)0x0) {
        plVar8 = (long *)0x0;
      }
      do {
        if (plVar18 == plVar8) goto LAB_00253f74;
        lVar4 = *plVar18;
      } while ((SBORROW8(lVar4,-lVar19) == lVar4 + lVar19 < 0) &&
              (plVar18 = plVar18 + 1, lVar4 < lVar19));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x4f1) {
      pRVar13 = Specification::NeuralNetworkLayer::reducemin(layer);
      pRVar3 = (pRVar13->axes_).rep_;
      plVar18 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        plVar18 = (long *)0x0;
      }
      plVar8 = pRVar3->elements + (pRVar13->axes_).current_size_;
      if (pRVar3 == (Rep *)0x0) {
        plVar8 = (long *)0x0;
      }
      do {
        if (plVar18 == plVar8) goto LAB_00253f74;
        lVar4 = *plVar18;
      } while ((SBORROW8(lVar4,-lVar19) == lVar4 + lVar19 < 0) &&
              (plVar18 = plVar18 + 1, lVar4 < lVar19));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x4f6) {
      pRVar15 = Specification::NeuralNetworkLayer::reducesum(layer);
      pRVar3 = (pRVar15->axes_).rep_;
      plVar18 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        plVar18 = (long *)0x0;
      }
      plVar8 = pRVar3->elements + (pRVar15->axes_).current_size_;
      if (pRVar3 == (Rep *)0x0) {
        plVar8 = (long *)0x0;
      }
      do {
        if (plVar18 == plVar8) goto LAB_00253f74;
        lVar4 = *plVar18;
      } while (((int)-uVar1 <= lVar4) && (plVar18 = plVar18 + 1, lVar4 < lVar19));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x4fb) {
      pRVar14 = Specification::NeuralNetworkLayer::reduceprod(layer);
      pRVar3 = (pRVar14->axes_).rep_;
      plVar18 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        plVar18 = (long *)0x0;
      }
      plVar8 = pRVar3->elements + (pRVar14->axes_).current_size_;
      if (pRVar3 == (Rep *)0x0) {
        plVar8 = (long *)0x0;
      }
      do {
        if (plVar18 == plVar8) goto LAB_00253f74;
        lVar4 = *plVar18;
      } while (((int)-uVar1 <= lVar4) && (plVar18 = plVar18 + 1, lVar4 < lVar19));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x500) {
      pRVar9 = Specification::NeuralNetworkLayer::reducemean(layer);
      pRVar3 = (pRVar9->axes_).rep_;
      plVar18 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        plVar18 = (long *)0x0;
      }
      plVar8 = pRVar3->elements + (pRVar9->axes_).current_size_;
      if (pRVar3 == (Rep *)0x0) {
        plVar8 = (long *)0x0;
      }
      do {
        if (plVar18 == plVar8) goto LAB_00253f74;
        lVar4 = *plVar18;
      } while (((int)-uVar1 <= lVar4) && (plVar18 = plVar18 + 1, lVar4 < lVar19));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x505) {
      pRVar12 = Specification::NeuralNetworkLayer::reducelogsum(layer);
      pRVar3 = (pRVar12->axes_).rep_;
      plVar18 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        plVar18 = (long *)0x0;
      }
      plVar8 = pRVar3->elements + (pRVar12->axes_).current_size_;
      if (pRVar3 == (Rep *)0x0) {
        plVar8 = (long *)0x0;
      }
      do {
        if (plVar18 == plVar8) goto LAB_00253f74;
        lVar4 = *plVar18;
      } while (((int)-uVar1 <= lVar4) && (plVar18 = plVar18 + 1, lVar4 < lVar19));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else if (uVar2 == 0x50a) {
      pRVar11 = Specification::NeuralNetworkLayer::reducesumsquare(layer);
      pRVar3 = (pRVar11->axes_).rep_;
      plVar18 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        plVar18 = (long *)0x0;
      }
      plVar8 = pRVar3->elements + (pRVar11->axes_).current_size_;
      if (pRVar3 == (Rep *)0x0) {
        plVar8 = (long *)0x0;
      }
      do {
        if (plVar18 == plVar8) goto LAB_00253f74;
        lVar4 = *plVar18;
      } while (((int)-uVar1 <= lVar4) && (plVar18 = plVar18 + 1, lVar4 < lVar19));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    else {
      if (uVar2 != 0x50f) {
LAB_00253f74:
        std::__cxx11::string::~string((string *)&err);
        goto LAB_00253f7c;
      }
      pRVar7 = Specification::NeuralNetworkLayer::reducelogsumexp(layer);
      pRVar3 = (pRVar7->axes_).rep_;
      plVar18 = pRVar3->elements;
      if (pRVar3 == (Rep *)0x0) {
        plVar18 = (long *)0x0;
      }
      plVar8 = pRVar3->elements + (pRVar7->axes_).current_size_;
      if (pRVar3 == (Rep *)0x0) {
        plVar8 = (long *)0x0;
      }
      do {
        if (plVar18 == plVar8) goto LAB_00253f74;
        lVar4 = *plVar18;
      } while (((int)-uVar1 <= lVar4) && (plVar18 = plVar18 + 1, lVar4 < lVar19));
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
    }
    std::__cxx11::string::~string((string *)&err);
  }
  std::__cxx11::string::~string((string *)&r.m_message);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateReductionTypeLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }
    // all given axes should be in range [-inputRank : inputRank)
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";

        switch (layer.layer_case()) {
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL1:
                for (const auto& axis : layer.reducel1().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceL2:
                for (const auto& axis : layer.reducel2().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMax:
                for (const auto& axis : layer.reducemax().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMin:
                for (const auto& axis : layer.reducemin().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSum:
                for (const auto& axis : layer.reducesum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceProd:
                for (const auto& axis : layer.reduceprod().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceMean:
                for (const auto& axis : layer.reducemean().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSum:
                for (const auto& axis : layer.reducelogsum().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceSumSquare:
                for (const auto& axis : layer.reducesumsquare().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;
            case Specification::NeuralNetworkLayer::LayerCase::kReduceLogSumExp:
                for (const auto& axis : layer.reducelogsumexp().axes()) {
                    if (axis < -rank || axis >= rank) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
                    }
                }
                break;

            default:
                break;
        }
    }
    return r;
}